

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

RealisticCamera *
pbrt::RealisticCamera::Create
          (ParameterDictionary *parameters,CameraTransform *cameraTransform,FilmHandle *film,
          MediumHandle *medium,FileLoc *loc,Allocator alloc)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Point2i resolution;
  pointer pcVar4;
  size_t sVar5;
  int i_1;
  int iVar6;
  int iVar7;
  memory_resource *pmVar8;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar9;
  long *plVar10;
  RealisticCamera *p;
  uint uVar11;
  size_t sVar12;
  long *plVar13;
  Point2i resolution_00;
  int i;
  _Alloc_hider _Var14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  Point2i PVar20;
  long lVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  float fVar24;
  Float FVar25;
  undefined1 auVar26 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_pbrt::Point2<float>_> vert;
  span<const_pbrt::Point2<float>_> vert_00;
  int builtinRes;
  Float focusDistance;
  Float apertureDiameter;
  string apertureName;
  vector<float,_std::allocator<float>_> lensParameters;
  string lensFile;
  anon_class_16_2_5a488c63 rasterize;
  Image apertureImage;
  Image mono;
  string ret;
  ImageChannelDesc rgbDesc;
  CameraBaseParameters cameraBaseParameters;
  polymorphic_allocator<std::byte> local_900;
  undefined1 local_8f8 [16];
  long local_8e0;
  int local_8d8;
  float local_8d4;
  Float local_8d0;
  Float local_8cc;
  string local_8c8;
  ImageChannelValues local_8a8;
  vector<float,_std::allocator<float>_> local_878;
  string local_860;
  anon_class_16_2_5a488c63 local_840;
  undefined1 local_830 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_820;
  ColorEncodingHandle local_780;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_778;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_758;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_738;
  undefined1 local_718 [32];
  undefined1 auStack_6f8 [32];
  long alStack_6d8 [2];
  long local_6c8 [26];
  undefined1 local_5f8 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5e8;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_548;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_540;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_520;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_500 [9];
  ColorEncodingHandle local_3e0;
  ColorEncodingHandle local_3d8;
  ColorEncodingHandle local_3d0;
  ColorEncodingHandle local_3c8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_3c0;
  TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> local_3b8;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_3b0;
  CameraBaseParameters local_380;
  undefined4 extraout_var;
  
  local_3b8.bits = (film->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits;
  local_3c0.bits =
       (medium->
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
       ).bits;
  local_900.memoryResource = alloc.memoryResource;
  CameraBaseParameters::CameraBaseParameters
            (&local_380,cameraTransform,(FilmHandle *)&local_3b8,(MediumHandle *)&local_3c0,
             parameters,loc);
  local_830._0_8_ = &local_820;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"lensfile","");
  pcVar4 = local_718 + 0x10;
  local_718._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"");
  ParameterDictionary::GetOneString
            ((string *)local_5f8,parameters,(string *)local_830,(string *)local_718);
  ResolveFilename(&local_860,(string *)local_5f8);
  if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_5f8._0_8_ != &local_5e8) {
    operator_delete((void *)local_5f8._0_8_,
                    CONCAT71(local_5e8.alloc.memoryResource._1_7_,
                             local_5e8.alloc.memoryResource._0_1_) + 1);
  }
  if ((pointer)local_718._0_8_ != pcVar4) {
    operator_delete((void *)local_718._0_8_,local_718._16_8_ + 1);
  }
  if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_830._0_8_ != &local_820) {
    operator_delete((void *)local_830._0_8_,(ulong)((long)local_820.alloc.memoryResource + 1));
  }
  local_5f8._0_8_ = &local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"aperturediameter","");
  local_8cc = ParameterDictionary::GetOneFloat(parameters,(string *)local_5f8,1.0);
  if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_5f8._0_8_ != &local_5e8) {
    local_8f8._0_4_ = local_8cc;
    operator_delete((void *)local_5f8._0_8_,
                    CONCAT71(local_5e8.alloc.memoryResource._1_7_,
                             local_5e8.alloc.memoryResource._0_1_) + 1);
    local_8cc = (Float)local_8f8._0_4_;
  }
  local_5f8._0_8_ = &local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"focusdistance","");
  local_8d0 = ParameterDictionary::GetOneFloat(parameters,(string *)local_5f8,10.0);
  if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_5f8._0_8_ != &local_5e8) {
    local_8f8._0_4_ = local_8d0;
    operator_delete((void *)local_5f8._0_8_,
                    CONCAT71(local_5e8.alloc.memoryResource._1_7_,
                             local_5e8.alloc.memoryResource._0_1_) + 1);
    local_8d0 = (Float)local_8f8._0_4_;
  }
  if (local_860._M_string_length == 0) {
    Error(loc,"No lens description file supplied!");
    p = (RealisticCamera *)0x0;
    goto LAB_0038d96d;
  }
  ReadFloatFile(&local_878,&local_860);
  if (local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_5f8._8_8_ = 0;
    local_5e8.alloc.memoryResource._0_1_ = '\0';
    local_5f8._0_8_ = &local_5e8;
    detail::stringPrintfRecursive<std::__cxx11::string&>
              ((string *)local_5f8,"Error reading lens specification file \"%s\".",&local_860);
    Error(loc,(char *)local_5f8._0_8_);
LAB_0038d930:
    if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_5f8._0_8_ != &local_5e8) {
      operator_delete((void *)local_5f8._0_8_,
                      CONCAT71(local_5e8.alloc.memoryResource._1_7_,
                               local_5e8.alloc.memoryResource._0_1_) + 1);
    }
    p = (RealisticCamera *)0x0;
  }
  else {
    if (((long)local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start & 0xcU) != 0) {
      local_5f8._8_8_ = 0;
      local_830._0_4_ =
           (undefined4)
           ((ulong)((long)local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2);
      local_5e8.alloc.memoryResource._0_1_ = '\0';
      local_5f8._0_8_ = &local_5e8;
      detail::stringPrintfRecursive<std::__cxx11::string&,int>
                ((string *)local_5f8,
                 "%s: excess values in lens specification file; must be multiple-of-four values, read %d."
                 ,&local_860,(int *)local_830);
      Error(loc,(char *)local_5f8._0_8_);
      goto LAB_0038d930;
    }
    local_840.builtinRes = &local_8d8;
    local_840.alloc = &local_900;
    local_8d8 = 0x100;
    local_830._0_8_ = &local_820;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"aperture","");
    local_718._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"");
    ParameterDictionary::GetOneString
              ((string *)local_5f8,parameters,(string *)local_830,(string *)local_718);
    ResolveFilename(&local_8c8,(string *)local_5f8);
    if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_5f8._0_8_ != &local_5e8) {
      operator_delete((void *)local_5f8._0_8_,
                      CONCAT71(local_5e8.alloc.memoryResource._1_7_,
                               local_5e8.alloc.memoryResource._0_1_) + 1);
    }
    if ((pointer)local_718._0_8_ != pcVar4) {
      operator_delete((void *)local_718._0_8_,local_718._16_8_ + 1);
    }
    if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_830._0_8_ != &local_820) {
      operator_delete((void *)local_830._0_8_,(ulong)((long)local_820.alloc.memoryResource + 1));
    }
    pmVar8 = pstd::pmr::new_delete_resource();
    local_830._0_4_ = U256;
    local_830._4_4_ = 0;
    local_830._8_4_ = 0;
    local_820.alloc.memoryResource = pstd::pmr::new_delete_resource();
    local_820.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_780.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    local_820.nAlloc = 0;
    local_820.nStored = 0;
    local_778.ptr = (uchar *)0x0;
    local_778.nAlloc = 0;
    local_778.nStored = 0;
    local_758.ptr = (Half *)0x0;
    local_758.nAlloc = 0;
    local_758.nStored = 0;
    local_738.ptr = (float *)0x0;
    local_738.nAlloc = 0;
    local_738.nStored = 0;
    local_778.alloc.memoryResource = pmVar8;
    local_758.alloc.memoryResource = pmVar8;
    local_738.alloc.memoryResource = pmVar8;
    if (local_8c8._M_string_length != 0) {
      iVar6 = std::__cxx11::string::compare((char *)&local_8c8);
      iVar7 = local_8d8;
      if (iVar6 == 0) {
        local_718._0_8_ = pcVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"Y","");
        PVar20.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
        PVar20.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
        local_3c8.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )0;
        channels_00.n = 1;
        channels_00.ptr =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718;
        Image::Image((Image *)local_5f8,Float,PVar20,channels_00,&local_3c8,
                     (Allocator)local_900.memoryResource);
        local_830._8_4_ = local_5f8._8_4_;
        local_830._0_4_ = (undefined4)local_5f8._0_8_;
        local_830._4_4_ = SUB84(local_5f8._0_8_,4);
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_820,&local_5e8);
        local_780.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )local_548.bits;
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                  (&local_778,&local_540);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                  (&local_758,&local_520);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  (&local_738,local_500);
        local_500[0].nStored = 0;
        (*(local_500[0].alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_500[0].alloc.memoryResource,local_500[0].ptr,local_500[0].nAlloc << 2,4);
        local_520.nStored = 0;
        (*(local_520.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_520.alloc.memoryResource,local_520.ptr,local_520.nAlloc * 2,2);
        local_540.nStored = 0;
        (*(local_540.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_540.alloc.memoryResource,local_540.ptr,local_540.nAlloc,1);
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector(&local_5e8);
        if ((pointer)local_718._0_8_ != pcVar4) {
          operator_delete((void *)local_718._0_8_,local_718._16_8_ + 1);
        }
        if (0 < (int)local_830._8_4_) {
          lVar21 = 0;
          lVar19 = 0;
          uVar11 = local_830._4_4_;
          iVar7 = local_830._8_4_;
          do {
            if (0 < (int)uVar11) {
              fVar24 = (float)(int)lVar19 + 0.5;
              lVar16 = 0;
              local_8f8 = ZEXT416((uint)(fVar24 + fVar24));
              do {
                fVar24 = (float)(int)lVar16 + 0.5;
                auVar23 = vpinsrd_avx(ZEXT416(uVar11),iVar7,1);
                auVar23 = vcvtdq2ps_avx(auVar23);
                auVar2 = vinsertps_avx(ZEXT416((uint)(fVar24 + fVar24)),
                                       ZEXT416((uint)local_8f8._0_4_),0x10);
                auVar23 = vdivps_avx(auVar2,auVar23);
                auVar2._8_4_ = 0xbf800000;
                auVar2._0_8_ = 0xbf800000bf800000;
                auVar2._12_4_ = 0xbf800000;
                auVar23 = vaddps_avx512vl(auVar23,auVar2);
                auVar26._0_4_ = auVar23._0_4_ * auVar23._0_4_;
                auVar26._4_4_ = auVar23._4_4_ * auVar23._4_4_;
                auVar26._8_4_ = auVar23._8_4_ * auVar23._8_4_;
                auVar26._12_4_ = auVar23._12_4_ * auVar23._12_4_;
                auVar23 = vhaddps_avx(auVar26,auVar26);
                auVar3._8_4_ = 0x80000000;
                auVar3._0_8_ = 0x8000000080000000;
                auVar3._12_4_ = 0x80000000;
                auVar23 = vxorps_avx512vl(auVar23,auVar3);
                fVar24 = expf(auVar23._0_4_);
                auVar23 = vmaxss_avx(ZEXT416((uint)(fVar24 + -0.36787945)),ZEXT416(0));
                Image::SetChannel((Image *)local_830,(Point2i)(lVar21 + lVar16),0,auVar23._0_4_);
                lVar16 = lVar16 + 1;
                uVar11 = local_830._4_4_;
                iVar7 = local_830._8_4_;
              } while (lVar16 < (int)local_830._4_4_);
            }
            lVar19 = lVar19 + 1;
            lVar21 = lVar21 + 0x100000000;
          } while (lVar19 < iVar7);
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_8c8);
        iVar7 = local_8d8;
        if (iVar6 == 0) {
          local_718._0_8_ = pcVar4;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"Y","");
          resolution_00.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
          resolution_00.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
          local_3d0.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )0;
          channels_01.n = 1;
          channels_01.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718;
          Image::Image((Image *)local_5f8,Float,resolution_00,channels_01,&local_3d0,
                       (Allocator)local_900.memoryResource);
          Image::operator=((Image *)local_830,(Image *)local_5f8);
          Image::~Image((Image *)local_5f8);
          if ((pointer)local_718._0_8_ != pcVar4) {
            operator_delete((void *)local_718._0_8_,local_718._16_8_ + 1);
          }
          lVar19 = CONCAT44(local_830._8_4_,local_830._4_4_);
          if (0 < (int)local_830._8_4_) {
            lVar16 = 0;
            lVar21 = 0;
            do {
              if (0 < (int)lVar19) {
                lVar18 = 0;
                do {
                  Image::SetChannel((Image *)local_830,(Point2i)(lVar16 + lVar18),0,1.0);
                  lVar19 = CONCAT44(local_830._8_4_,local_830._4_4_);
                  lVar18 = lVar18 + 1;
                } while (lVar18 < (int)local_830._4_4_);
              }
              lVar21 = lVar21 + 1;
              lVar16 = lVar16 + 0x100000000;
            } while (lVar21 < lVar19 >> 0x20);
          }
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)&local_8c8);
          if (iVar7 == 0) {
            lVar19 = 0;
            local_718._0_4_ = 0.0;
            local_718._4_4_ = 1.0;
            local_718._8_4_ = 0x3f737870;
            local_718._12_4_ = 0x3e9e377a;
            local_718._16_8_ = 0xbf4f1bbd3f167918;
            local_718._24_8_ = 0xbf4f1bbdbf167918;
            auStack_6f8._0_8_ = (pointer)0x3e9e377abf737870;
            do {
              auVar23._0_4_ = (float)*(undefined8 *)(local_718 + lVar19 * 8) * 0.8;
              auVar23._4_4_ = (float)((ulong)*(undefined8 *)(local_718 + lVar19 * 8) >> 0x20) * 0.8;
              auVar23._8_8_ = 0;
              uVar1 = vmovlps_avx(auVar23);
              *(undefined8 *)(local_718 + lVar19 * 8) = uVar1;
              lVar19 = lVar19 + 1;
            } while (lVar19 != 5);
            vert.n = 5;
            vert.ptr = (Point2<float> *)local_718;
            Create::anon_class_16_2_5a488c63::operator()((Image *)local_5f8,&local_840,vert);
            Image::operator=((Image *)local_830,(Image *)local_5f8);
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)&local_8c8);
            if (iVar7 != 0) {
              local_3d8.
              super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
              .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                       )0;
              Image::Read((ImageAndMetadata *)local_5f8,&local_8c8,
                          (Allocator)local_900.memoryResource,&local_3d8);
              Image::operator=((Image *)local_830,(Image *)local_5f8);
              if (1 < (int)local_820.nStored) {
                local_718._0_8_ = pcVar4;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"R","");
                auStack_6f8._0_8_ = auStack_6f8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)auStack_6f8,"G","");
                _Var14._M_p = (pointer)local_6c8;
                alStack_6d8[0] = (long)_Var14._M_p;
                std::__cxx11::string::_M_construct<char_const*>((string *)alStack_6d8,"B","");
                requestedChannels.n = 3;
                requestedChannels.ptr =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718;
                Image::GetChannelDesc
                          ((ImageChannelDesc *)&local_3b0,(Image *)local_830,requestedChannels);
                lVar19 = -0x60;
                do {
                  if ((long *)_Var14._M_p != *(long **)((long)_Var14._M_p + -0x10)) {
                    operator_delete(*(long **)((long)_Var14._M_p + -0x10),*(long *)_Var14._M_p + 1);
                  }
                  _Var14._M_p = _Var14._M_p + -0x20;
                  lVar19 = lVar19 + 0x20;
                } while (lVar19 != 0);
                if (local_3b0.nStored == 0) {
                  ErrorExit<std::__cxx11::string&>
                            ("%s: didn\'t find R, G, B channels to average for aperture image.",
                             &local_8c8);
                }
                resolution.super_Tuple2<pbrt::Point2,_int>.y = local_830._8_4_;
                resolution.super_Tuple2<pbrt::Point2,_int>.x = local_830._4_4_;
                local_8a8.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                alloc.memoryResource =
                     (memory_resource *)
                     &local_8a8.
                      super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                      field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"Y","");
                local_3e0.
                super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                         )0;
                channels.n = 1;
                channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_8a8;
                Image::Image((Image *)local_718,Float,resolution,channels,&local_3e0,
                             (Allocator)local_900.memoryResource);
                pcVar4 = (pointer)local_718._0_8_;
                if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)local_8a8.
                       super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc
                       .memoryResource !=
                    &local_8a8.
                     super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.field_2
                   ) {
                  operator_delete(local_8a8.
                                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  .alloc.memoryResource,
                                  local_8a8.
                                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  .field_2._0_8_ + 1);
                  pcVar4 = (pointer)local_718._0_8_;
                }
                local_718._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
                lVar19 = CONCAT44(local_718._8_4_,local_718._4_4_);
                if (0 < (int)local_718._8_4_) {
                  local_8e0 = 0;
                  do {
                    if (0 < (int)lVar19) {
                      uVar17 = 0;
                      uVar15 = local_8e0 << 0x20;
                      local_718._0_8_ = pcVar4;
                      do {
                        PVar20.super_Tuple2<pbrt::Point2,_int> =
                             (Tuple2<pbrt::Point2,_int>)(uVar15 | uVar17);
                        Image::GetChannels(&local_8a8,(Image *)local_830,PVar20,
                                           (ImageChannelDesc *)&local_3b0,(WrapMode2D)0x200000002);
                        sVar5 = local_8a8.
                                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                .nStored;
                        if (local_8a8.
                            super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                            nStored == 0) {
                          fVar24 = 0.0;
                        }
                        else {
                          fVar24 = 0.0;
                          paVar9 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                                    *)local_8a8.
                                      super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                      .ptr;
                          if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                               *)local_8a8.
                                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                 .ptr ==
                              (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                               *)0x0) {
                            paVar9 = &local_8a8.
                                      super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                      .field_2;
                          }
                          sVar12 = 0;
                          do {
                            fVar24 = fVar24 + paVar9->fixed[sVar12];
                            sVar12 = sVar12 + 1;
                          } while (local_8a8.
                                   super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   .nStored != sVar12);
                        }
                        local_8a8.
                        super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                        nStored = 0;
                        local_8f8._0_4_ = fVar24;
                        (**(code **)(*(long *)local_8a8.
                                              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                              .alloc.memoryResource + 0x18))
                                  (local_8a8.
                                   super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   .alloc.memoryResource,
                                   local_8a8.
                                   super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   .ptr,local_8a8.
                                        super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                        .nAlloc << 2,4);
                        Image::SetChannel((Image *)local_718,PVar20,0,
                                          (float)local_8f8._0_4_ / (float)(long)sVar5);
                        lVar19 = CONCAT44(local_718._8_4_,local_718._4_4_);
                        uVar17 = uVar17 + 1;
                        pcVar4 = (pointer)local_718._0_8_;
                      } while ((long)uVar17 < (long)(int)local_718._4_4_);
                    }
                    local_8e0 = local_8e0 + 1;
                  } while (local_8e0 < lVar19 >> 0x20);
                }
                local_718._0_8_ = pcVar4;
                Image::operator=((Image *)local_830,(Image *)local_718);
                Image::~Image((Image *)local_718);
                InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                          (&local_3b0);
              }
              ImageAndMetadata::~ImageAndMetadata((ImageAndMetadata *)local_5f8);
              goto LAB_0038e3ac;
            }
            uVar15 = 0;
            alStack_6d8[0] = 0;
            alStack_6d8[1] = 0;
            local_718._0_4_ = 0.0;
            local_718._4_4_ = 0.0;
            local_718._8_4_ = 0;
            local_718._12_4_ = 0;
            local_718._16_8_ = 0;
            local_718._24_8_ = 0;
            auStack_6f8._0_8_ = (pointer)0x0;
            auStack_6f8._8_8_ = 0;
            auStack_6f8._16_8_ = 0;
            auStack_6f8._24_8_ = 0;
            do {
              local_8f8._0_4_ = *(undefined4 *)(&DAT_029197a8 + (ulong)((uVar15 & 1) == 0) * 4);
              local_8d4 = ((float)(int)uVar15 * 3.1415927) / 5.0;
              fVar24 = cosf(local_8d4);
              local_8e0 = CONCAT44(local_8e0._4_4_,fVar24 * (float)local_8f8._0_4_);
              fVar24 = sinf(local_8d4);
              *(undefined4 *)(local_718 + uVar15 * 8) = (undefined4)local_8e0;
              *(float *)(local_718 + uVar15 * 8 + 4) = fVar24 * (float)local_8f8._0_4_;
              uVar15 = uVar15 + 1;
            } while (uVar15 != 10);
            plVar10 = alStack_6d8 + 1;
            plVar13 = (long *)(local_718 + 8);
            do {
              lVar19 = plVar13[-1];
              plVar13[-1] = *plVar10;
              *plVar10 = lVar19;
              plVar10 = plVar10 + -1;
              bVar22 = plVar13 < plVar10;
              plVar13 = plVar13 + 1;
            } while (bVar22);
            vert_00.n = 10;
            vert_00.ptr = (Point2<float> *)local_718;
            Create::anon_class_16_2_5a488c63::operator()((Image *)local_5f8,&local_840,vert_00);
            Image::operator=((Image *)local_830,(Image *)local_5f8);
          }
          Image::~Image((Image *)local_5f8);
        }
      }
LAB_0038e3ac:
      if (((0 < (int)local_830._4_4_) && (0 < (int)local_830._8_4_)) && (0 < (int)local_830._8_4_))
      {
        fVar24 = 0.0;
        lVar21 = 0;
        lVar19 = 0;
        uVar11 = local_830._4_4_;
        iVar7 = local_830._8_4_;
        do {
          if (0 < (int)uVar11) {
            lVar16 = 0;
            do {
              local_8f8._0_4_ = fVar24;
              FVar25 = Image::GetChannel((Image *)local_830,(Point2i)(lVar21 + lVar16),0,
                                         (WrapMode2D)0x200000002);
              lVar16 = lVar16 + 1;
              fVar24 = (float)local_8f8._0_4_ + FVar25;
              uVar11 = local_830._4_4_;
              iVar7 = local_830._8_4_;
            } while (lVar16 < (int)local_830._4_4_);
          }
          lVar19 = lVar19 + 1;
          lVar21 = lVar21 + 0x100000000;
        } while (lVar19 < iVar7);
        if (0 < iVar7) {
          lVar21 = 0;
          lVar19 = 0;
          local_8f8._0_4_ = 0.7853982 / (fVar24 / (float)(int)(iVar7 * uVar11));
          do {
            if (0 < (int)uVar11) {
              lVar16 = 0;
              do {
                FVar25 = Image::GetChannel((Image *)local_830,(Point2i)(lVar21 + lVar16),0,
                                           (WrapMode2D)0x200000002);
                Image::SetChannel((Image *)local_830,(Point2i)(lVar21 + lVar16),0,
                                  FVar25 * (float)local_8f8._0_4_);
                lVar16 = lVar16 + 1;
                uVar11 = local_830._4_4_;
                iVar7 = local_830._8_4_;
              } while (lVar16 < (int)local_830._4_4_);
            }
            lVar19 = lVar19 + 1;
            lVar21 = lVar21 + 0x100000000;
          } while (lVar19 < iVar7);
        }
      }
    }
    iVar7 = (*(local_900.memoryResource)->_vptr_memory_resource[2])
                      (local_900.memoryResource,0x4e8,8);
    p = (RealisticCamera *)CONCAT44(extraout_var,iVar7);
    pstd::pmr::polymorphic_allocator<std::byte>::
    construct<pbrt::RealisticCamera,pbrt::CameraBaseParameters&,std::vector<float,std::allocator<float>>&,float&,float&,pbrt::Image,pstd::pmr::polymorphic_allocator<std::byte>&>
              (&local_900,p,&local_380,&local_878,&local_8d0,&local_8cc,(Image *)local_830,
               &local_900);
    local_738.nStored = 0;
    (*(local_738.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_738.alloc.memoryResource,local_738.ptr,local_738.nAlloc << 2,4);
    local_758.nStored = 0;
    (*(local_758.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_758.alloc.memoryResource,local_758.ptr,local_758.nAlloc * 2,2);
    local_778.nStored = 0;
    (*(local_778.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_778.alloc.memoryResource,local_778.ptr,local_778.nAlloc,1);
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_820);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
      operator_delete(local_8c8._M_dataplus._M_p,local_8c8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0038d96d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
  }
  return p;
}

Assistant:

RealisticCamera *RealisticCamera::Create(const ParameterDictionary &parameters,
                                         const CameraTransform &cameraTransform,
                                         FilmHandle film, MediumHandle medium,
                                         const FileLoc *loc, Allocator alloc) {
    CameraBaseParameters cameraBaseParameters(cameraTransform, film, medium, parameters,
                                              loc);

    // Realistic camera-specific parameters
    std::string lensFile = ResolveFilename(parameters.GetOneString("lensfile", ""));
    Float apertureDiameter = parameters.GetOneFloat("aperturediameter", 1.0);
    Float focusDistance = parameters.GetOneFloat("focusdistance", 10.0);

    if (lensFile.empty()) {
        Error(loc, "No lens description file supplied!");
        return nullptr;
    }
    // Load element data from lens description file
    std::vector<Float> lensParameters = ReadFloatFile(lensFile);
    if (lensParameters.empty()) {
        Error(loc, "Error reading lens specification file \"%s\".", lensFile);
        return nullptr;
    }
    if (lensParameters.size() % 4 != 0) {
        Error(loc,
              "%s: excess values in lens specification file; "
              "must be multiple-of-four values, read %d.",
              lensFile, (int)lensParameters.size());
        return nullptr;
    }

    int builtinRes = 256;
    auto rasterize = [&](pstd::span<const Point2f> vert) {
        Image image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"}, nullptr, alloc);

        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x) {
                Point2f p(-1 + 2 * (x + 0.5f) / image.Resolution().x,
                          -1 + 2 * (y + 0.5f) / image.Resolution().y);
                int windingNumber = 0;
                // Test against edges
                for (int i = 0; i < vert.size(); ++i) {
                    int i1 = (i + 1) % vert.size();
                    Float e = (p[0] - vert[i][0]) * (vert[i1][1] - vert[i][1]) -
                              (p[1] - vert[i][1]) * (vert[i1][0] - vert[i][0]);
                    if (vert[i].y <= p.y) {
                        if (vert[i1].y > p.y && e > 0)
                            ++windingNumber;
                    } else if (vert[i1].y <= p.y && e < 0)
                        --windingNumber;
                }

                image.SetChannel({x, y}, 0, windingNumber == 0 ? 0.f : 1.f);
            }

        return image;
    };

    std::string apertureName = ResolveFilename(parameters.GetOneString("aperture", ""));
    Image apertureImage;
    if (!apertureName.empty()) {
        // built-in diaphragm shapes
        if (apertureName == "gaussian") {
            apertureImage = Image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"},
                                  nullptr, alloc);
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x) {
                    Point2f uv(-1 + 2 * (x + 0.5f) / apertureImage.Resolution().x,
                               -1 + 2 * (y + 0.5f) / apertureImage.Resolution().y);
                    Float r2 = Sqr(uv.x) + Sqr(uv.y);
                    Float sigma2 = 1;
                    Float v = std::max<Float>(
                        0, std::exp(-r2 / sigma2) - std::exp(-1 / sigma2));
                    apertureImage.SetChannel({x, y}, 0, v);
                }
        } else if (apertureName == "square") {
            apertureImage = Image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"},
                                  nullptr, alloc);
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x)
                    apertureImage.SetChannel({x, y}, 0, 1.f);
        } else if (apertureName == "pentagon") {
            // https://mathworld.wolfram.com/RegularPentagon.html
            Float c1 = (std::sqrt(5.f) - 1) / 4;
            Float c2 = (std::sqrt(5.f) + 1) / 4;
            Float s1 = std::sqrt(10.f + 2.f * std::sqrt(5.f)) / 4;
            Float s2 = std::sqrt(10.f - 2.f * std::sqrt(5.f)) / 4;
            // Vertices in CW order.
            Point2f vert[5] = {Point2f(0, 1), {s1, c1}, {s2, -c2}, {-s2, -c2}, {-s1, c1}};
            // Scale down slightly
            for (int i = 0; i < 5; ++i)
                vert[i] *= .8f;
            apertureImage = rasterize(vert);
        } else if (apertureName == "star") {
            // 5-sided. Vertices are two pentagons--inner and outer radius
            pstd::array<Point2f, 10> vert;
            for (int i = 0; i < 10; ++i) {
                // inner radius: https://math.stackexchange.com/a/2136996
                Float r =
                    (i & 1) ? 1.f : (std::cos(Radians(72.f)) / std::cos(Radians(36.f)));
                vert[i] = Point2f(r * std::cos(Pi * i / 5.f), r * std::sin(Pi * i / 5.f));
            }
            std::reverse(vert.begin(), vert.end());
            apertureImage = rasterize(vert);
        } else {
            ImageAndMetadata im = Image::Read(apertureName, alloc);
            apertureImage = std::move(im.image);
            if (apertureImage.NChannels() > 1) {
                ImageChannelDesc rgbDesc = apertureImage.GetChannelDesc({"R", "G", "B"});
                if (!rgbDesc)
                    ErrorExit("%s: didn't find R, G, B channels to average for "
                              "aperture image.",
                              apertureName);

                Image mono(PixelFormat::Float, apertureImage.Resolution(), {"Y"}, nullptr,
                           alloc);
                for (int y = 0; y < mono.Resolution().y; ++y)
                    for (int x = 0; x < mono.Resolution().x; ++x) {
                        Float avg = apertureImage.GetChannels({x, y}, rgbDesc).Average();
                        mono.SetChannel({x, y}, 0, avg);
                    }

                apertureImage = std::move(mono);
            }
        }

        if (apertureImage) {
            // Normalize it so that brightness matches a circular aperture
            Float sum = 0;
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x)
                    sum += apertureImage.GetChannel({x, y}, 0);
            Float avg =
                sum / (apertureImage.Resolution().x * apertureImage.Resolution().y);

            Float scale = (Pi / 4) / avg;
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x)
                    apertureImage.SetChannel({x, y}, 0,
                                             apertureImage.GetChannel({x, y}, 0) * scale);
        }
    }

    return alloc.new_object<RealisticCamera>(cameraBaseParameters, lensParameters,
                                             focusDistance, apertureDiameter,
                                             std::move(apertureImage), alloc);
}